

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jama_lu.h
# Opt level: O3

Array2D<double> * __thiscall
JAMA::LU<double>::permute_copy
          (Array2D<double> *__return_storage_ptr__,LU<double> *this,Array2D<double> *A,
          Array1D<int> *piv,int j0,int j1)

{
  int m;
  int *piVar1;
  double **ppdVar2;
  double **ppdVar3;
  double *pdVar4;
  double *pdVar5;
  long lVar6;
  long lVar7;
  int n;
  
  m = piv->n_;
  n = (j1 - j0) + 1;
  TNT::Array2D<double>::Array2D(__return_storage_ptr__,m,n);
  if (0 < (long)m) {
    piVar1 = piv->data_;
    ppdVar2 = (A->v_).data_;
    ppdVar3 = (__return_storage_ptr__->v_).data_;
    lVar6 = 0;
    do {
      if (j0 <= j1) {
        pdVar4 = ppdVar3[lVar6];
        pdVar5 = ppdVar2[piVar1[lVar6]];
        lVar7 = 0;
        do {
          pdVar4[lVar7] = pdVar5[j0 + lVar7];
          lVar7 = lVar7 + 1;
        } while (n != (int)lVar7);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != m);
  }
  return __return_storage_ptr__;
}

Assistant:

Array2D<Real> permute_copy(const Array2D<Real> &A, 
   			const Array1D<int> &piv, int j0, int j1)
	{
		int piv_length = piv.dim();

		Array2D<Real> X(piv_length, j1-j0+1);


         for (int i = 0; i < piv_length; i++) 
            for (int j = j0; j <= j1; j++) 
               X[i][j-j0] = A[piv[i]][j];

		return X;
	}